

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_callmeta(lua_State *L,int obj,char *event)

{
  int iVar1;
  int local_2c;
  char *event_local;
  int obj_local;
  lua_State *L_local;
  
  local_2c = obj;
  if ((obj < 1) && (-10000 < obj)) {
    iVar1 = lua_gettop(L);
    local_2c = iVar1 + obj + 1;
  }
  iVar1 = luaL_getmetafield(L,local_2c,event);
  if (iVar1 != 0) {
    lua_pushvalue(L,local_2c);
    lua_call(L,1,1);
  }
  L_local._4_4_ = (uint)(iVar1 != 0);
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_callmeta (lua_State *L, int obj, const char *event) {
  obj = abs_index(L, obj);
  if (!luaL_getmetafield(L, obj, event))  /* no metafield? */
    return 0;
  lua_pushvalue(L, obj);
  lua_call(L, 1, 1);
  return 1;
}